

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

void __thiscall
sqlite_orm::internal::storage_base::drop_table_internal
          (storage_base *this,string *tableName,sqlite3 *db)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  stringstream ss;
  string local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  stringstream local_1a0 [16];
  sqlite3 *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  storage_base *in_stack_fffffffffffffe80;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)&stack0xfffffffffffffe70,"DROP TABLE \'");
  std::operator+(&local_1d0,in_RSI,"\'");
  std::operator<<(poVar1,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  perform_query_without_result
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void drop_table_internal(const std::string &tableName, sqlite3 *db) {
        std::stringstream ss;
        ss << "DROP TABLE '" << tableName + "'";
        this->perform_query_without_result(ss.str(), db);
    }